

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O0

void fight_prog_skean(OBJ_DATA *obj,CHAR_DATA *ch)

{
  bool bVar1;
  short sVar2;
  int iVar3;
  CClass *pCVar4;
  long in_RSI;
  OBJ_DATA *in_RDI;
  __type_conflict2 _Var5;
  AFFECT_DATA af;
  int percent;
  void *in_stack_ffffffffffffff78;
  int size;
  CHAR_DATA *ch_00;
  int in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  char_data *in_stack_ffffffffffffff90;
  undefined2 in_stack_ffffffffffffff98;
  undefined2 uVar6;
  short sVar7;
  undefined2 uVar8;
  undefined2 in_stack_ffffffffffffffa2;
  undefined2 in_stack_ffffffffffffffa4;
  undefined2 in_stack_ffffffffffffffa6;
  
  bVar1 = is_worn(in_RDI);
  if ((bVar1) && (iVar3 = number_percent(), iVar3 < 6)) {
    number_percent();
    pCVar4 = char_data::Class(in_stack_ffffffffffffff90);
    if ((pCVar4->ctype != 2) ||
       (bVar1 = is_affected(*(CHAR_DATA **)(in_RSI + 0x20),(int)gsn_severed), bVar1)) {
      ch_00 = *(CHAR_DATA **)(in_RSI + 0x1e8);
      _Var5 = std::pow<int,int>(0,0x665216);
      if (((ulong)ch_00 & (long)_Var5) == 0) {
        act((char *)in_stack_ffffffffffffff90,
            (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
            (void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),ch_00,0);
        act((char *)in_stack_ffffffffffffff90,
            (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
            (void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),ch_00,0);
        iVar3 = (int)((ulong)ch_00 >> 0x20);
        init_affect((AFFECT_DATA *)0x66527e);
        uVar6 = 0;
        uVar8 = *(undefined2 *)(in_RSI + 0x138);
        sVar7 = gsn_bleeding;
        std::pow<int,int>(0,0x6652b9);
        iVar3 = dice(in_stack_ffffffffffffff80,iVar3);
        new_affect_to_char((CHAR_DATA *)
                           CONCAT26(in_stack_ffffffffffffffa6,
                                    CONCAT24(in_stack_ffffffffffffffa4,
                                             CONCAT22(in_stack_ffffffffffffffa2,(short)iVar3))),
                           (AFFECT_DATA *)
                           CONCAT26(uVar8,CONCAT24(sVar7,CONCAT22(uVar6,in_stack_ffffffffffffff98)))
                          );
      }
      else {
        bVar1 = is_good(ch_00);
        if (bVar1) {
          act((char *)in_stack_ffffffffffffff90,
              (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
              (void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),ch_00,0);
          WAIT_STATE(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
        }
      }
    }
    else {
      act((char *)in_stack_ffffffffffffff90,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
          (void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
          in_stack_ffffffffffffff78,0);
      act((char *)in_stack_ffffffffffffff90,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
          (void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
          in_stack_ffffffffffffff78,0);
      size = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
      init_affect((AFFECT_DATA *)0x665188);
      uVar6 = 0;
      uVar8 = *(undefined2 *)(in_RSI + 0x138);
      sVar7 = gsn_severed;
      iVar3 = dice(in_stack_ffffffffffffff80,size);
      sVar2 = (short)iVar3 + 10;
      iVar3 = dice(in_stack_ffffffffffffff80,size);
      new_affect_to_char((CHAR_DATA *)
                         CONCAT26(in_stack_ffffffffffffffa6,
                                  CONCAT24(sVar2,CONCAT22(in_stack_ffffffffffffffa2,(short)iVar3))),
                         (AFFECT_DATA *)
                         CONCAT26(uVar8,CONCAT24(sVar7,CONCAT22(uVar6,in_stack_ffffffffffffff98))));
    }
  }
  return;
}

Assistant:

void fight_prog_skean(OBJ_DATA *obj, CHAR_DATA *ch)
{
	int percent;
	AFFECT_DATA af;

	if (!is_worn(obj))
		return;

	if (number_percent() < 6)
	{
		percent = number_percent();
		if (ch->fighting->Class()->ctype == CLASS_COMMUNER && !is_affected(ch->fighting, gsn_severed))
		{
			act("An enchanted obsidian skean blazes through the air, leaving a trail of fire!", ch, 0, ch->fighting, TO_ROOM);
			act("Your vital ties to the gods' empowerment have been severed!", ch, 0, ch->fighting, TO_VICT);

			init_affect(&af);
			af.where = TO_AFFECTS;
			af.aftype = AFT_SKILL;
			af.type = gsn_severed;
			af.level = ch->level;
			af.modifier = 10 + dice(1, 8);
			af.duration = dice(1, 2);
			new_affect_to_char(ch->fighting, &af);

			return;
		}

		if (!IS_SET(ch->affected_by, AFF_BLIND))
		{
			act("An enchanted obsidian skean darts toward your eyes, gouging you painfully!", ch, 0, ch->fighting, TO_VICT);
			act("An enchanted obsidian skean darts toward $N's eyes, gouging $M painfully!", ch, 0, ch->fighting, TO_NOTVICT);

			init_affect(&af);
			af.where = TO_AFFECTS;
			af.aftype = AFT_SKILL;
			af.level = ch->level;
			af.type = gsn_bleeding;

			SET_BIT(af.bitvector, AFF_BLIND);
			af.duration = dice(1, 4);
			new_affect_to_char(ch->fighting, &af);

			return;
		}

		if (is_good(ch->fighting))
		{
			act("You swoon for a moment, and the world goes slightly hazy...", ch->fighting, 0, 0, TO_CHAR);
			WAIT_STATE(ch->fighting, PULSE_VIOLENCE * 2);
			return;
		}
	}
}